

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void * reg_malloc(c2m_ctx_t c2m_ctx,size_t s)

{
  int *piVar1;
  VARR_void_ptr_t *pVVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  long lVar5;
  MIR_context_t pMVar6;
  VARR_uint8_t *pVVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  void *pvVar11;
  void_ptr_t *ppvVar12;
  ulong uVar13;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VARR_char *in_RCX;
  uint *puVar14;
  tab_str_t *res;
  uint *puVar15;
  ulong extraout_RDX;
  int iVar16;
  ulong *puVar17;
  uint uVar18;
  uint uVar19;
  c2m_ctx_t pcVar20;
  c2m_ctx_t __ptr;
  c2m_ctx_t pcVar21;
  uint uVar22;
  char *pcVar23;
  uint uVar24;
  VARR_char *pVVar25;
  char *unaff_R14;
  tab_str_t *ptVar26;
  size_t unaff_R15;
  size_t sVar27;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  
  pcVar20 = (c2m_ctx_t)s;
  pvVar11 = malloc(s);
  if (pvVar11 == (void *)0x0) {
    s = 0;
    pcVar20 = c2m_ctx;
    (*c2m_ctx->error_func)(c2m_ctx,C_alloc_error,"no memory");
    pVVar2 = c2m_ctx->reg_memory;
    ppvVar12 = pVVar2->varr;
    if (ppvVar12 != (void_ptr_t *)0x0) {
      sVar27 = pVVar2->els_num;
      uVar13 = sVar27 + 1;
      if (pVVar2->size < uVar13) {
        sVar27 = (uVar13 >> 1) + uVar13;
        ppvVar12 = (void_ptr_t *)realloc(ppvVar12,sVar27 * 8);
        pVVar2->varr = ppvVar12;
        pVVar2->size = sVar27;
        sVar27 = pVVar2->els_num;
        uVar13 = sVar27 + 1;
      }
      pVVar2->els_num = uVar13;
      ppvVar12[sVar27] = (void_ptr_t)0x0;
      return (void *)0x0;
    }
  }
  else {
    pVVar2 = c2m_ctx->reg_memory;
    ppvVar12 = pVVar2->varr;
    if (ppvVar12 != (void_ptr_t *)0x0) {
      sVar27 = pVVar2->els_num;
      uVar13 = sVar27 + 1;
      if (pVVar2->size < uVar13) {
        sVar27 = (uVar13 >> 1) + uVar13;
        ppvVar12 = (void_ptr_t *)realloc(ppvVar12,sVar27 * 8);
        pVVar2->varr = ppvVar12;
        pVVar2->size = sVar27;
        sVar27 = pVVar2->els_num;
        uVar13 = sVar27 + 1;
      }
      pVVar2->els_num = uVar13;
      ppvVar12[sVar27] = pvVar11;
      return pvVar11;
    }
    reg_malloc_cold_1();
  }
  reg_malloc_cold_2();
  puVar3 = (ulong *)pcVar20->env[0].__jmpbuf[5];
  if (puVar3 == (ulong *)0x0) {
    HTAB_tab_str_t_do_cold_8();
LAB_001798b9:
    HTAB_tab_str_t_do_cold_7();
LAB_001798be:
    HTAB_tab_str_t_do_cold_4();
    __ptr = pcVar20;
LAB_001798c3:
    HTAB_tab_str_t_do_cold_3();
LAB_001798c8:
    HTAB_tab_str_t_do_cold_5();
LAB_001798cd:
    HTAB_tab_str_t_do_cold_6();
LAB_001798d2:
    HTAB_tab_str_t_do_cold_1();
  }
  else {
    puVar4 = (undefined8 *)pcVar20->env[0].__jmpbuf[4];
    if (puVar4 == (undefined8 *)0x0) goto LAB_001798b9;
    pVVar25 = (VARR_char *)pcVar20->env[0].__jmpbuf[0];
    uVar19 = (uint)*puVar3;
    iVar10 = (int)s;
    in_RCX = pVVar25;
    uVar22 = uVar19;
    if ((iVar10 != 1) || (iVar16 = (int)*puVar4, *(int *)&pcVar20->options != iVar16)) {
LAB_00179749:
      iVar16 = (*(code *)pcVar20->env[0].__jmpbuf[1])(pVVar25);
      uVar19 = iVar16 + (uint)(iVar16 == 0);
      s = (size_t)uVar19;
      lVar5 = pcVar20->env[0].__jmpbuf[5];
      if (lVar5 == 0) goto LAB_001798be;
      in_RCX = (VARR_char *)pcVar20->env[0].__jmpbuf[4];
      __ptr = pcVar20;
      if (in_RCX != (VARR_char *)0x0) {
        lVar5 = *(long *)(lVar5 + 0x10);
        pcVar23 = in_RCX->varr;
        puVar15 = (uint *)0x0;
        uVar24 = uVar19;
        uVar18 = uVar19;
        do {
          uVar18 = uVar18 & uVar22 - 1;
          puVar14 = (uint *)(lVar5 + (ulong)uVar18 * 4);
          uVar13 = (ulong)*puVar14;
          if (uVar13 != 0xfffffffe) {
            if (*puVar14 == 0xffffffff) {
              if (iVar10 != 1) {
                return (void *)0x0;
              }
              *(int *)&pcVar20->ctx = *(int *)&pcVar20->ctx + 1;
              if (puVar15 != (uint *)0x0) {
                puVar14 = puVar15;
              }
              uVar22 = *(uint *)&pcVar20->options;
              *(uint *)(pcVar23 + (ulong)uVar22 * 0x28) = uVar19;
              pcVar23 = pcVar23 + (ulong)uVar22 * 0x28 + 8;
              *(char **)pcVar23 = unaff_R14;
              *(size_t *)(pcVar23 + 8) = unaff_R15;
              *(size_t *)(pcVar23 + 0x10) = unaff_retaddr;
              *(size_t *)(pcVar23 + 0x18) = in_stack_00000008;
              uVar19 = *(uint *)&pcVar20->options;
              *(uint *)&pcVar20->options = uVar19 + 1;
              *puVar14 = uVar19;
              (res->str).s = unaff_R14;
              (res->str).len = unaff_R15;
              res->key = unaff_retaddr;
              res->flags = in_stack_00000008;
              return (void *)0x0;
            }
            puVar14 = puVar15;
            if ((*(uint *)(pcVar23 + uVar13 * 0x28) == uVar19) &&
               (iVar16 = (*(code *)pcVar20->env[0].__jmpbuf[2])(pVVar25), iVar16 != 0)) {
              sVar27 = *(size_t *)(pcVar23 + uVar13 * 0x28 + 0x10);
              sVar8 = *(size_t *)(pcVar23 + uVar13 * 0x28 + 0x18);
              sVar9 = *(size_t *)(pcVar23 + uVar13 * 0x28 + 0x20);
              (res->str).s = *(char **)(pcVar23 + uVar13 * 0x28 + 8);
              (res->str).len = sVar27;
              res->key = sVar8;
              res->flags = sVar9;
              return &DAT_00000001;
            }
          }
          piVar1 = (int *)((long)&pcVar20->options + 4);
          *piVar1 = *piVar1 + 1;
          uVar24 = uVar24 >> 0xb;
          uVar18 = uVar24 + 1 + uVar18 * 5;
          puVar15 = puVar14;
        } while( true );
      }
      goto LAB_001798c3;
    }
    __ptr = (c2m_ctx_t)puVar3[2];
    if (__ptr == (c2m_ctx_t)0x0) goto LAB_001798cd;
    uVar22 = uVar19 * 2;
    uVar13 = (ulong)uVar22;
    if (puVar3[1] != uVar13) {
      s = uVar13 * 4;
      pvVar11 = realloc(__ptr,s);
      puVar3[2] = (ulong)pvVar11;
      puVar17 = (ulong *)pcVar20->env[0].__jmpbuf[5];
      puVar3[1] = uVar13;
      *puVar3 = uVar13;
      if (puVar17 != (ulong *)0x0) goto LAB_00179646;
      goto LAB_001798d2;
    }
    *puVar3 = uVar13;
    puVar17 = puVar3;
LAB_00179646:
    if (uVar22 != 0) {
      __ptr = (c2m_ctx_t)puVar17[2];
      s = 0xff;
      memset(__ptr,0xff,(ulong)(uVar19 & 0x7fffffff) << 3);
    }
    puVar3 = (ulong *)pcVar20->env[0].__jmpbuf[4];
    if ((puVar3 == (ulong *)0x0) || (__ptr = (c2m_ctx_t)puVar3[2], __ptr == (c2m_ctx_t)0x0))
    goto LAB_001798c8;
    uVar13 = (ulong)(uint)(iVar16 * 2);
    if (puVar3[1] == uVar13) {
      *puVar3 = uVar13;
      puVar17 = puVar3;
LAB_001796c8:
      in_RCX = (VARR_char *)puVar17[2];
      uVar19 = *(uint *)((long)&pcVar20->ctx + 4);
      uVar18 = *(uint *)&pcVar20->options;
      *(undefined4 *)&pcVar20->ctx = 0;
      *(undefined4 *)&pcVar20->options = 0;
      *(undefined4 *)((long)&pcVar20->ctx + 4) = 0;
      if (uVar19 < uVar18) {
        iVar16 = uVar18 - uVar19;
        ptVar26 = (tab_str_t *)((long)in_RCX + (ulong)uVar19 * 0x28 + 8);
        do {
          if ((int)ptVar26[-1].flags != 0) {
            HTAB_tab_str_t_do((HTAB_tab_str_t *)pcVar20,*ptVar26,HTAB_INSERT,res);
            (*(code *)pcVar20->env[0].__jmpbuf[2])(pVVar25);
          }
          ptVar26 = (tab_str_t *)&ptVar26[1].str.len;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
      goto LAB_00179749;
    }
    s = uVar13 * 0x28;
    pvVar11 = realloc(__ptr,s);
    puVar3[2] = (ulong)pvVar11;
    puVar17 = (ulong *)pcVar20->env[0].__jmpbuf[4];
    puVar3[1] = uVar13;
    *puVar3 = uVar13;
    if (puVar17 != (ulong *)0x0) goto LAB_001796c8;
  }
  HTAB_tab_str_t_do_cold_2();
  pMVar6 = __ptr->ctx;
  pcVar20 = __ptr;
  if (pMVar6->unspec_protos == (VARR_MIR_proto_t *)0x0) {
LAB_00179984:
    pMVar6 = __ptr->ctx;
    pcVar21 = (c2m_ctx_t)pMVar6->temp_string;
    if ((pcVar21 == (c2m_ctx_t)0x0) ||
       (pcVar20 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[0], pcVar20 == (c2m_ctx_t)0x0)) {
      pcVar21 = pcVar20;
      HTAB_tab_str_t_destroy_cold_4();
    }
    else {
      free(pcVar20);
      free(pcVar21);
      pMVar6->temp_string = (VARR_char *)0x0;
      pMVar6 = __ptr->ctx;
      pVVar7 = pMVar6->temp_data;
      if ((pVVar7 != (VARR_uint8_t *)0x0) &&
         (pcVar21 = (c2m_ctx_t)pVVar7->varr, pcVar21 != (c2m_ctx_t)0x0)) {
        free(pcVar21);
        free(pVVar7);
        pMVar6->temp_data = (VARR_uint8_t *)0x0;
        free(__ptr->ctx);
        __ptr->ctx = (MIR_context_t)0x0;
        return extraout_RAX;
      }
    }
    HTAB_tab_str_t_destroy_cold_3();
    pcVar20 = pcVar21;
  }
  else {
    in_RCX = pMVar6->temp_string;
    if (in_RCX != (VARR_char *)0x0) {
      uVar19 = *(uint *)&pMVar6->c2mir_ctx;
      if (uVar19 != 0) {
        pcVar21 = (c2m_ctx_t)pMVar6->error_func;
        pVVar25 = (VARR_char *)0x0;
        pcVar23 = in_RCX->varr + 8;
        do {
          if (*(int *)(pcVar23 + -8) != 0) {
            pcVar20 = pcVar21;
            (*(code *)pMVar6->unspec_protos)();
            uVar19 = *(uint *)&pMVar6->c2mir_ctx;
          }
          pVVar25 = (VARR_char *)((long)&pVVar25->els_num + 1);
          pcVar23 = pcVar23 + 0x28;
          in_RCX = (VARR_char *)(ulong)uVar19;
        } while (pVVar25 < in_RCX);
      }
      iVar10 = (int)in_RCX;
      *(undefined4 *)&pMVar6->c2mir_ctx = 0;
      pMVar6->gen_ctx = (gen_ctx *)0x0;
      pVVar7 = pMVar6->temp_data;
      if (pVVar7 == (VARR_uint8_t *)0x0) goto LAB_001799ff;
      in_RCX = (VARR_char *)pVVar7->els_num;
      if ((int)in_RCX != 0) {
        pcVar20 = (c2m_ctx_t)pVVar7->varr;
        s = 0xff;
        memset(pcVar20,0xff,((ulong)in_RCX & 0xffffffff) << 2);
      }
      goto LAB_00179984;
    }
  }
  iVar10 = (int)in_RCX;
  HTAB_tab_str_t_destroy_cold_2();
LAB_001799ff:
  HTAB_tab_str_t_destroy_cold_1();
  pvVar11 = extraout_RAX_00;
  if (-1 < (int)extraout_RDX) {
    iVar16 = fprintf((FILE *)pcVar20,"%s:%d",s,extraout_RDX & 0xffffffff);
    pvVar11 = (void *)CONCAT44(extraout_var,iVar16);
    if (iVar10 != 0) {
      iVar10 = fprintf((FILE *)pcVar20,":%d: ",extraout_RDX >> 0x20);
      return (void *)CONCAT44(extraout_var_00,iVar10);
    }
  }
  return pvVar11;
}

Assistant:

static void *reg_malloc (c2m_ctx_t c2m_ctx, size_t s) {
  void *mem = malloc (s);

  if (mem == NULL) alloc_error (c2m_ctx, "no memory");
  VARR_PUSH (void_ptr_t, reg_memory, mem);
  return mem;
}